

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

BinaryenExpressionRef
BinaryenArraySet(BinaryenModuleRef module,BinaryenExpressionRef ref,BinaryenExpressionRef index,
                BinaryenExpressionRef value)

{
  ArraySet *pAVar1;
  Builder local_30;
  Expression *local_28;
  BinaryenExpressionRef value_local;
  BinaryenExpressionRef index_local;
  BinaryenExpressionRef ref_local;
  BinaryenModuleRef module_local;
  
  local_28 = value;
  value_local = index;
  index_local = ref;
  ref_local = (BinaryenExpressionRef)module;
  wasm::Builder::Builder(&local_30,module);
  pAVar1 = wasm::Builder::makeArraySet(&local_30,index_local,value_local,local_28);
  return (BinaryenExpressionRef)pAVar1;
}

Assistant:

BinaryenExpressionRef BinaryenArraySet(BinaryenModuleRef module,
                                       BinaryenExpressionRef ref,
                                       BinaryenExpressionRef index,
                                       BinaryenExpressionRef value) {
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeArraySet((Expression*)ref, (Expression*)index, (Expression*)value));
}